

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

uint64_t ReadCompactSize<ParamsStream<BufferedFile&,TransactionSerParams>>
                   (ParamsStream<BufferedFile_&,_TransactionSerParams> *is,bool range_check)

{
  ulong uVar1;
  char *pcVar2;
  size_t in_RCX;
  int __fd;
  long in_FS_OFFSET;
  uint8_t obj;
  byte local_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  int iStack_34;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = (int)&local_38;
  BufferedFile::read(is->m_substream,__fd,(void *)0x1,in_RCX);
  uVar1 = (ulong)local_38;
  if (0xfc < uVar1) {
    if (uVar1 == 0xfe) {
      BufferedFile::read(is->m_substream,__fd,(void *)0x4,in_RCX);
      uVar1 = (ulong)CONCAT22(uStack_36,CONCAT11(uStack_37,local_38));
      if (uVar1 < 0x10000) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        local_38 = 1;
        uStack_37 = 0;
        uStack_36 = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar2,(error_code *)"non-canonical ReadCompactSize()");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0042e30c;
      }
    }
    else if (local_38 == 0xfd) {
      BufferedFile::read(is->m_substream,__fd,(void *)0x2,in_RCX);
      uVar1 = (ulong)CONCAT11(uStack_37,local_38);
      if (uVar1 < 0xfd) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        local_38 = 1;
        uStack_37 = 0;
        uStack_36 = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar2,(error_code *)"non-canonical ReadCompactSize()");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0042e30c;
      }
    }
    else {
      BufferedFile::read(is->m_substream,__fd,&DAT_00000008,in_RCX);
      uVar1 = CONCAT44(iStack_34,CONCAT22(uStack_36,CONCAT11(uStack_37,local_38)));
      if (iStack_34 == 0) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        local_38 = 1;
        uStack_37 = 0;
        uStack_36 = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar2,(error_code *)"non-canonical ReadCompactSize()");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0042e30c;
      }
    }
  }
  if (range_check && 0x2000000 < uVar1) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    local_30 = std::iostream_category();
    local_38 = 1;
    uStack_37 = 0;
    uStack_36 = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar2,(error_code *)"ReadCompactSize(): size too large");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar1;
  }
LAB_0042e30c:
  __stack_chk_fail();
}

Assistant:

uint64_t ReadCompactSize(Stream& is, bool range_check = true)
{
    uint8_t chSize = ser_readdata8(is);
    uint64_t nSizeRet = 0;
    if (chSize < 253)
    {
        nSizeRet = chSize;
    }
    else if (chSize == 253)
    {
        nSizeRet = ser_readdata16(is);
        if (nSizeRet < 253)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else if (chSize == 254)
    {
        nSizeRet = ser_readdata32(is);
        if (nSizeRet < 0x10000u)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else
    {
        nSizeRet = ser_readdata64(is);
        if (nSizeRet < 0x100000000ULL)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    if (range_check && nSizeRet > MAX_SIZE) {
        throw std::ios_base::failure("ReadCompactSize(): size too large");
    }
    return nSizeRet;
}